

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O1

bool cmDependsFortran::ModulesDiffer(char *modFile,char *stampFile,char *compilerId)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  long *plVar6;
  ostream *poVar7;
  char cVar8;
  char seq [2];
  char seq_1 [1];
  ifstream finModFile;
  ifstream finStampFile;
  undefined2 local_43c;
  allocator local_439;
  string local_438;
  byte abStack_418 [488];
  string local_230;
  byte abStack_210 [488];
  
  iVar4 = strcmp(compilerId,"SunPro");
  if (iVar4 == 0) {
    std::__cxx11::string::string((string *)&local_438,modFile,(allocator *)&local_43c);
    std::__cxx11::string::string((string *)&local_230,stampFile,&local_439);
    bVar2 = cmsys::SystemTools::FilesDiffer(&local_438,&local_230);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_dataplus._M_p == &local_438.field_2) {
      return bVar2;
    }
    operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
    return bVar2;
  }
  std::ifstream::ifstream(&local_438,modFile,_S_in);
  std::ifstream::ifstream(&local_230,stampFile,_S_in);
  bVar2 = true;
  if (((abStack_418[*(long *)(local_438._M_dataplus._M_p + -0x18)] & 5) != 0) ||
     ((abStack_210[*(long *)(local_230._M_dataplus._M_p + -0x18)] & 5) != 0)) goto LAB_00424e52;
  iVar4 = strcmp(compilerId,"GNU");
  if (iVar4 == 0) {
    plVar6 = (long *)std::istream::read((char *)&local_438,(long)&local_43c);
    uVar1 = *(uint *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20);
    std::istream::seekg(&local_438,0,0);
    if ((((uVar1 & 5) != 0) || (local_43c._0_1_ != (allocator)0x1f)) || (local_43c._1_1_ != -0x75))
    {
      local_439 = (allocator)0xa;
      bVar3 = cmDependsFortranStreamContainsSequence((istream *)&local_438,(char *)&local_439,1);
      if (!bVar3) {
        poVar7 = std::operator<<((ostream *)&std::cerr,compilerId);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," fortran module ",0x10);
        poVar7 = std::operator<<(poVar7,modFile);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," has unexpected format.",0x17);
        std::endl<char,std::char_traits<char>>(poVar7);
        goto LAB_00424e52;
      }
      bVar3 = cmDependsFortranStreamContainsSequence((istream *)&local_230,(char *)&local_439,1);
      goto LAB_00424fcf;
    }
  }
  else {
    iVar4 = strcmp(compilerId,"Intel");
    if (iVar4 == 0) {
      local_43c = 10;
      bVar3 = cmDependsFortranStreamContainsSequence((istream *)&local_438,(char *)&local_43c,2);
      if (!bVar3) {
        poVar7 = std::operator<<((ostream *)&std::cerr,compilerId);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," fortran module ",0x10);
        poVar7 = std::operator<<(poVar7,modFile);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," has unexpected format.",0x17);
        std::endl<char,std::char_traits<char>>(poVar7);
        goto LAB_00424e52;
      }
      bVar3 = cmDependsFortranStreamContainsSequence((istream *)&local_230,(char *)&local_43c,2);
LAB_00424fcf:
      if (bVar3 == false) goto LAB_00424e52;
    }
  }
  do {
    iVar4 = std::istream::get();
    iVar5 = std::istream::get();
    bVar3 = (abStack_210[*(long *)(local_230._M_dataplus._M_p + -0x18)] & 5) == 0;
    cVar8 = !bVar3 * '\x02';
    if (iVar4 != iVar5) {
      cVar8 = '\x02';
    }
    if ((abStack_418[*(long *)(local_438._M_dataplus._M_p + -0x18)] & 5) != 0) {
      cVar8 = bVar3 + '\x01';
    }
  } while (cVar8 == '\0');
  if (cVar8 == '\x01') {
    bVar2 = false;
  }
LAB_00424e52:
  std::ifstream::~ifstream(&local_230);
  std::ifstream::~ifstream(&local_438);
  return bVar2;
}

Assistant:

bool cmDependsFortran::ModulesDiffer(const char* modFile,
                                     const char* stampFile,
                                     const char* compilerId)
{
  /*
  gnu >= 4.9:
    A mod file is an ascii file compressed with gzip.
    Compiling twice produces identical modules.

  gnu < 4.9:
    A mod file is an ascii file.
    <bar.mod>
    FORTRAN module created from /path/to/foo.f90 on Sun Dec 30 22:47:58 2007
    If you edit this, you'll get what you deserve.
    ...
    </bar.mod>
    As you can see the first line contains the date.

  intel:
    A mod file is a binary file.
    However, looking into both generated bar.mod files with a hex editor
    shows that they differ only before a sequence linefeed-zero (0x0A 0x00)
    which is located some bytes in front of the absoulte path to the source
    file.

  sun:
    A mod file is a binary file.  Compiling twice produces identical modules.

  others:
    TODO ...
  */


  /* Compilers which do _not_ produce different mod content when the same
   * source is compiled twice
   *   -SunPro
   */
  if(strcmp(compilerId, "SunPro") == 0)
    {
    return cmSystemTools::FilesDiffer(modFile, stampFile);
    }

#if defined(_WIN32) || defined(__CYGWIN__)
  cmsys::ifstream finModFile(modFile, std::ios::in | std::ios::binary);
  cmsys::ifstream finStampFile(stampFile, std::ios::in | std::ios::binary);
#else
  cmsys::ifstream finModFile(modFile, std::ios::in);
  cmsys::ifstream finStampFile(stampFile, std::ios::in);
#endif
  if(!finModFile || !finStampFile)
    {
    // At least one of the files does not exist.  The modules differ.
    return true;
    }

  /* Compilers which _do_ produce different mod content when the same
   * source is compiled twice
   *   -GNU
   *   -Intel
   *
   * Eat the stream content until all recompile only related changes
   * are left behind.
   */
  if (strcmp(compilerId, "GNU") == 0 )
    {
    // GNU Fortran 4.9 and later compress .mod files with gzip
    // but also do not include a date so we can fall through to
    // compare them without skipping any prefix.
    unsigned char hdr[2];
    bool okay = finModFile.read(reinterpret_cast<char*>(hdr), 2)? true:false;
    finModFile.seekg(0);
    if(!(okay && hdr[0] == 0x1f && hdr[1] == 0x8b))
      {
      const char seq[1] = {'\n'};
      const int seqlen = 1;

      if(!cmDependsFortranStreamContainsSequence(finModFile, seq, seqlen))
        {
        // The module is of unexpected format.  Assume it is different.
        std::cerr << compilerId << " fortran module " << modFile
                  << " has unexpected format." << std::endl;
        return true;
        }

      if(!cmDependsFortranStreamContainsSequence(finStampFile, seq, seqlen))
        {
        // The stamp must differ if the sequence is not contained.
        return true;
        }
      }
    }
  else if(strcmp(compilerId, "Intel") == 0)
    {
    const char seq[2] = {'\n', '\0'};
    const int seqlen = 2;

    if(!cmDependsFortranStreamContainsSequence(finModFile, seq, seqlen))
      {
      // The module is of unexpected format.  Assume it is different.
      std::cerr << compilerId << " fortran module " << modFile
                << " has unexpected format." << std::endl;
      return true;
      }

    if(!cmDependsFortranStreamContainsSequence(finStampFile, seq, seqlen))
      {
      // The stamp must differ if the sequence is not contained.
      return true;
      }
    }

  // Compare the remaining content.  If no compiler id matched above,
  // including the case none was given, this will compare the whole
  // content.
  if(!cmDependsFortranStreamsDiffer(finModFile, finStampFile))
    {
    return false;
    }

   // The modules are different.
   return true;
}